

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_adaptive_eval.h
# Opt level: O1

void __thiscall
embree::avx::FeatureAdaptiveEval<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>::eval
          (FeatureAdaptiveEval<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_> *this,
          CatmullClarkPatch *patch,Vec2f *uv,float dscale,size_t depth,BezierCurve *border0,
          BezierCurve *border1,BezierCurve *border2,BezierCurve *border3)

{
  undefined8 *puVar1;
  DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *pDVar2;
  anon_struct_8_2_947311e6_for_anon_union_8_2_4062524c_for_Vec2<float>_1_0 aVar3;
  anon_union_8_2_4062524c_for_Vec2<float>_1 aVar4;
  uint uVar5;
  int iVar6;
  undefined1 *puVar7;
  vfloat_impl<4> *pvVar8;
  vfloat_impl<4> *pvVar9;
  vfloat_impl<4> *pvVar10;
  vfloat_impl<4> *pvVar11;
  undefined1 auVar12 [16];
  undefined8 uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  ulong uVar21;
  long *plVar22;
  long lVar23;
  long lVar24;
  undefined1 *puVar25;
  ulong uVar26;
  long *plVar27;
  bool bVar28;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar29;
  undefined1 *puVar30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  float fVar35;
  undefined4 in_XMM0_Db;
  float fVar41;
  undefined4 in_XMM0_Dc;
  float fVar42;
  undefined4 in_XMM0_Dd;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  float fVar43;
  float t1;
  float fVar45;
  undefined1 auVar46 [16];
  float fVar44;
  undefined1 auVar47 [16];
  float fVar49;
  float fVar50;
  float fVar51;
  undefined1 auVar48 [64];
  float fVar52;
  float fVar53;
  float fVar57;
  float fVar58;
  vfloat_impl<4> vVar54;
  vfloat_impl<4> vVar55;
  undefined1 auVar56 [16];
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar71;
  float fVar73;
  float fVar74;
  float fVar76;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  float fVar72;
  float fVar75;
  float fVar77;
  float fVar78;
  undefined1 auVar66 [16];
  float fVar79;
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  float t0_1;
  float fVar80;
  float fVar81;
  float t0;
  undefined1 auVar82 [16];
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  undefined1 auVar88 [16];
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  undefined1 in_ZMM10 [64];
  undefined1 auVar93 [16];
  float fVar95;
  float fVar96;
  undefined1 auVar94 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  float fVar99;
  float fVar100;
  array_t<embree::CatmullClarkPatchT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>,_4UL> patches;
  undefined8 local_3540;
  undefined8 uStack_3538;
  undefined8 local_3520;
  undefined8 uStack_3518;
  undefined8 local_3500;
  undefined8 uStack_34f8;
  undefined1 local_34f0 [16];
  float local_34a0;
  float fStack_349c;
  float fStack_3498;
  float fStack_3494;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_3480;
  float local_3470;
  float fStack_346c;
  float fStack_3468;
  float fStack_3464;
  float local_3460;
  float fStack_345c;
  float fStack_3458;
  float fStack_3454;
  float local_3450;
  float fStack_344c;
  float fStack_3448;
  float fStack_3444;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_3440;
  float local_3430;
  float fStack_342c;
  float fStack_3428;
  float fStack_3424;
  float local_3420;
  float fStack_341c;
  float fStack_3418;
  float fStack_3414;
  float local_3410;
  float fStack_340c;
  float fStack_3408;
  float fStack_3404;
  float local_3400;
  float fStack_33fc;
  float fStack_33f8;
  float fStack_33f4;
  float local_33f0;
  float fStack_33ec;
  float fStack_33e8;
  float fStack_33e4;
  float local_33e0;
  float fStack_33dc;
  float fStack_33d8;
  float fStack_33d4;
  float local_33d0;
  float fStack_33cc;
  float fStack_33c8;
  float fStack_33c4;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_33c0;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_33b0;
  float local_33a0;
  float fStack_339c;
  float fStack_3398;
  float fStack_3394;
  float local_3390;
  float fStack_338c;
  float fStack_3388;
  float fStack_3384;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_3380;
  float local_3370;
  float fStack_336c;
  float fStack_3368;
  float fStack_3364;
  float local_3360;
  float fStack_335c;
  float fStack_3358;
  float fStack_3354;
  float local_3350;
  float fStack_334c;
  float fStack_3348;
  float fStack_3344;
  long local_3180 [320];
  undefined8 local_2780 [8];
  DynamicStackArray<float,_16UL,_64UL> DStack_2740;
  undefined8 local_26c0 [8];
  DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> aDStack_2680 [5];
  undefined8 local_1a80 [8];
  DynamicStackArray<float,_16UL,_64UL> DStack_1a40;
  undefined8 local_19c0 [8];
  DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> aDStack_1980 [5];
  undefined8 local_d80 [8];
  DynamicStackArray<float,_16UL,_64UL> DStack_d40;
  undefined8 local_cc0 [8];
  DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> aDStack_c80 [4];
  undefined1 local_380 [768];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_80 [5];
  
  local_34f0._4_4_ = in_XMM0_Db;
  local_34f0._0_4_ = dscale;
  local_34f0._8_4_ = in_XMM0_Dc;
  local_34f0._12_4_ = in_XMM0_Dd;
  do {
    auVar88 = in_ZMM10._0_16_;
    uVar5 = (patch->ring).items[0].face_valence;
    uVar21 = (ulong)uVar5;
    if (uVar21 == 0) {
      uVar21 = 0;
    }
    else {
      auVar36._8_8_ = 0;
      auVar36._0_8_ = uVar21 - 1;
      auVar36 = vpshufd_avx(auVar36,0x44);
      auVar48 = ZEXT1664((undefined1  [16])0x0);
      auVar56._8_8_ = 0x8000000000000000;
      auVar56._0_8_ = 0x8000000000000000;
      uVar26 = 0;
      auVar88 = vpcmpeqd_avx(auVar88,auVar88);
      auVar47._8_8_ = 1;
      auVar47._0_8_ = 1;
      do {
        auVar62._8_8_ = 0;
        auVar62._0_8_ = uVar26;
        auVar62 = vpshufd_avx(auVar62,0x44);
        auVar67._16_16_ = auVar62;
        auVar67._0_16_ = auVar62;
        auVar67 = vorps_avx(_DAT_02021e40,auVar67);
        auVar93 = vpcmpgtq_avx(auVar56 ^ auVar67._16_16_,auVar56 ^ auVar36);
        auVar62 = vpcmpgtq_avx(auVar56 ^ auVar67._0_16_,auVar56 ^ auVar36);
        auVar62 = vpackssdw_avx(auVar62,auVar93);
        auVar62 = vmaskmovps_avx(auVar88 ^ auVar62,
                                 *(undefined1 (*) [16])
                                  ((patch->ring).items[0].crease_weight.data + uVar26));
        auVar63 = auVar48._0_16_;
        auVar62 = vcmpps_avx(ZEXT816(0) << 0x40,auVar62,1);
        auVar37 = vshufps_avx(auVar62,auVar62,0xd4);
        auVar62 = vshufps_avx(auVar62,auVar62,0xfa);
        auVar62 = vandps_avx(auVar47,auVar62);
        auVar82 = auVar48._16_16_;
        auVar66 = vpaddq_avx(auVar82,auVar62);
        auVar62 = vandps_avx(auVar47,auVar37);
        auVar62 = vpaddq_avx(auVar63,auVar62);
        auVar48 = ZEXT3264(CONCAT1616(auVar66,auVar62));
        uVar26 = uVar26 + 4;
      } while ((uVar21 + 3 & 0x1fffffffc) != uVar26);
      auVar47 = vpcmpgtq_avx(auVar56 ^ auVar67._0_16_,auVar56 ^ auVar36);
      auVar36 = vblendvpd_avx(auVar66,auVar82,auVar93);
      auVar47 = vblendvpd_avx(auVar62,auVar63,auVar47);
      auVar36 = vpaddq_avx(auVar47,auVar36);
      auVar47 = vpshufd_avx(auVar36,0xee);
      auVar36 = vpaddq_avx(auVar36,auVar47);
      uVar21 = auVar36._0_8_;
    }
    iVar6 = (patch->ring).items[0].border_index;
    bVar31 = uVar21 == (uint)(iVar6 != -1) * 2;
    bVar18 = true;
    bVar28 = bVar31;
    bVar20 = bVar18;
    if (uVar5 == 2 && iVar6 != -1) {
      fVar60 = (patch->ring).items[0].vertex_crease_weight;
      if (((fVar60 != 0.0) || (NAN(fVar60))) && (fVar60 < INFINITY)) {
        bVar28 = false;
        bVar20 = false;
      }
    }
    else {
      fVar60 = (patch->ring).items[0].vertex_crease_weight;
      bVar28 = false;
      bVar20 = false;
      if (((fVar60 == 0.0) && (!NAN(fVar60))) &&
         (bVar28 = bVar31, bVar20 = bVar18, uVar5 != 3 || iVar6 == -1)) {
        bVar28 = (uVar5 == 4 && iVar6 == -1) && bVar31;
        bVar20 = uVar5 == 4 && iVar6 == -1;
      }
    }
    uVar5 = (patch->ring).items[1].face_valence;
    uVar21 = (ulong)uVar5;
    if (uVar21 == 0) {
      uVar21 = 0;
    }
    else {
      auVar37._8_8_ = 0;
      auVar37._0_8_ = uVar21 - 1;
      auVar36 = vpshufd_avx(auVar37,0x44);
      auVar48 = ZEXT1664((undefined1  [16])0x0);
      auVar93._8_8_ = 0x8000000000000000;
      auVar93._0_8_ = 0x8000000000000000;
      uVar26 = 0;
      auVar88 = vpcmpeqd_avx(auVar88,auVar88);
      auVar66._8_8_ = 1;
      auVar66._0_8_ = 1;
      do {
        auVar63._8_8_ = 0;
        auVar63._0_8_ = uVar26;
        auVar47 = vpshufd_avx(auVar63,0x44);
        auVar68._16_16_ = auVar47;
        auVar68._0_16_ = auVar47;
        auVar67 = vorps_avx(_DAT_02021e40,auVar68);
        auVar62 = vpcmpgtq_avx(auVar93 ^ auVar67._16_16_,auVar93 ^ auVar36);
        auVar47 = vpcmpgtq_avx(auVar93 ^ auVar67._0_16_,auVar93 ^ auVar36);
        auVar47 = vpackssdw_avx(auVar47,auVar62);
        auVar47 = vmaskmovps_avx(auVar88 ^ auVar47,
                                 *(undefined1 (*) [16])
                                  ((patch->ring).items[1].crease_weight.data + uVar26));
        auVar63 = auVar48._0_16_;
        auVar47 = vcmpps_avx(ZEXT816(0) << 0x40,auVar47,1);
        auVar37 = vshufps_avx(auVar47,auVar47,0xd4);
        auVar47 = vshufps_avx(auVar47,auVar47,0xfa);
        auVar47 = vandps_avx(auVar66,auVar47);
        auVar82 = auVar48._16_16_;
        auVar56 = vpaddq_avx(auVar82,auVar47);
        auVar47 = vandps_avx(auVar66,auVar37);
        auVar47 = vpaddq_avx(auVar63,auVar47);
        auVar48 = ZEXT3264(CONCAT1616(auVar56,auVar47));
        uVar26 = uVar26 + 4;
      } while ((uVar21 + 3 & 0x1fffffffc) != uVar26);
      auVar66 = vpcmpgtq_avx(auVar93 ^ auVar67._0_16_,auVar93 ^ auVar36);
      auVar36 = vblendvpd_avx(auVar56,auVar82,auVar62);
      auVar47 = vblendvpd_avx(auVar47,auVar63,auVar66);
      auVar36 = vpaddq_avx(auVar47,auVar36);
      auVar47 = vpshufd_avx(auVar36,0xee);
      auVar36 = vpaddq_avx(auVar36,auVar47);
      uVar21 = auVar36._0_8_;
    }
    iVar6 = (patch->ring).items[1].border_index;
    bVar32 = uVar21 == (uint)(iVar6 != -1) * 2;
    bVar17 = true;
    bVar18 = bVar32;
    bVar31 = bVar17;
    if (uVar5 == 2 && iVar6 != -1) {
      fVar60 = (patch->ring).items[1].vertex_crease_weight;
      if (((fVar60 != 0.0) || (NAN(fVar60))) && (fVar60 < INFINITY)) {
        bVar18 = false;
        bVar31 = false;
      }
    }
    else {
      fVar60 = (patch->ring).items[1].vertex_crease_weight;
      bVar18 = false;
      bVar31 = false;
      if (((fVar60 == 0.0) && (!NAN(fVar60))) &&
         (bVar18 = bVar32, bVar31 = bVar17, uVar5 != 3 || iVar6 == -1)) {
        bVar18 = (uVar5 == 4 && iVar6 == -1) && bVar32;
        bVar31 = uVar5 == 4 && iVar6 == -1;
      }
    }
    uVar5 = (patch->ring).items[2].face_valence;
    uVar21 = (ulong)uVar5;
    if (uVar21 == 0) {
      uVar21 = 0;
    }
    else {
      auVar38._8_8_ = 0;
      auVar38._0_8_ = uVar21 - 1;
      auVar36 = vpshufd_avx(auVar38,0x44);
      auVar48 = ZEXT1664((undefined1  [16])0x0);
      auVar12._8_8_ = 0x8000000000000000;
      auVar12._0_8_ = 0x8000000000000000;
      uVar26 = 0;
      auVar88 = vpcmpeqd_avx(auVar88,auVar88);
      auVar82._8_8_ = 1;
      auVar82._0_8_ = 1;
      do {
        auVar64._8_8_ = 0;
        auVar64._0_8_ = uVar26;
        auVar47 = vpshufd_avx(auVar64,0x44);
        auVar69._16_16_ = auVar47;
        auVar69._0_16_ = auVar47;
        auVar67 = vorps_avx(_DAT_02021e40,auVar69);
        auVar62 = vpcmpgtq_avx(auVar12 ^ auVar67._16_16_,auVar12 ^ auVar36);
        auVar47 = vpcmpgtq_avx(auVar12 ^ auVar67._0_16_,auVar12 ^ auVar36);
        auVar47 = vpackssdw_avx(auVar47,auVar62);
        auVar47 = vmaskmovps_avx(auVar88 ^ auVar47,
                                 *(undefined1 (*) [16])
                                  ((patch->ring).items[2].crease_weight.data + uVar26));
        auVar93 = auVar48._0_16_;
        auVar47 = vcmpps_avx(ZEXT816(0) << 0x40,auVar47,1);
        auVar66 = vshufps_avx(auVar47,auVar47,0xd4);
        auVar47 = vshufps_avx(auVar47,auVar47,0xfa);
        auVar47 = vandps_avx(auVar82,auVar47);
        auVar37 = auVar48._16_16_;
        auVar56 = vpaddq_avx(auVar37,auVar47);
        auVar47 = vandps_avx(auVar82,auVar66);
        auVar47 = vpaddq_avx(auVar93,auVar47);
        auVar48 = ZEXT3264(CONCAT1616(auVar56,auVar47));
        uVar26 = uVar26 + 4;
      } while ((uVar21 + 3 & 0x1fffffffc) != uVar26);
      auVar66 = vpcmpgtq_avx(auVar12 ^ auVar67._0_16_,auVar12 ^ auVar36);
      auVar36 = vblendvpd_avx(auVar56,auVar37,auVar62);
      auVar47 = vblendvpd_avx(auVar47,auVar93,auVar66);
      auVar36 = vpaddq_avx(auVar47,auVar36);
      auVar47 = vpshufd_avx(auVar36,0xee);
      auVar36 = vpaddq_avx(auVar36,auVar47);
      uVar21 = auVar36._0_8_;
    }
    iVar6 = (patch->ring).items[2].border_index;
    bVar33 = uVar21 == (uint)(iVar6 != -1) * 2;
    bVar16 = true;
    bVar17 = bVar33;
    bVar32 = bVar16;
    if (uVar5 == 2 && iVar6 != -1) {
      fVar60 = (patch->ring).items[2].vertex_crease_weight;
      if (((fVar60 != 0.0) || (NAN(fVar60))) && (fVar60 < INFINITY)) {
        bVar17 = false;
        bVar32 = false;
      }
    }
    else {
      fVar60 = (patch->ring).items[2].vertex_crease_weight;
      bVar17 = false;
      bVar32 = false;
      if (((fVar60 == 0.0) && (!NAN(fVar60))) &&
         (bVar17 = bVar33, bVar32 = bVar16, uVar5 != 3 || iVar6 == -1)) {
        bVar17 = (uVar5 == 4 && iVar6 == -1) && bVar33;
        bVar32 = uVar5 == 4 && iVar6 == -1;
      }
    }
    uVar5 = (patch->ring).items[3].face_valence;
    uVar21 = (ulong)uVar5;
    if (uVar21 == 0) {
      uVar21 = 0;
    }
    else {
      auVar39._8_8_ = 0;
      auVar39._0_8_ = uVar21 - 1;
      auVar36 = vpshufd_avx(auVar39,0x44);
      auVar48 = ZEXT1664((undefined1  [16])0x0);
      auVar15._8_8_ = 0x8000000000000000;
      auVar15._0_8_ = 0x8000000000000000;
      uVar26 = 0;
      auVar88 = vpcmpeqd_avx(auVar88,auVar88);
      auVar14._8_8_ = 1;
      auVar14._0_8_ = 1;
      do {
        auVar65._8_8_ = 0;
        auVar65._0_8_ = uVar26;
        auVar47 = vpshufd_avx(auVar65,0x44);
        auVar70._16_16_ = auVar47;
        auVar70._0_16_ = auVar47;
        auVar67 = vorps_avx(_DAT_02021e40,auVar70);
        auVar62 = vpcmpgtq_avx(auVar15 ^ auVar67._16_16_,auVar15 ^ auVar36);
        auVar47 = vpcmpgtq_avx(auVar15 ^ auVar67._0_16_,auVar15 ^ auVar36);
        auVar47 = vpackssdw_avx(auVar47,auVar62);
        auVar47 = vmaskmovps_avx(auVar88 ^ auVar47,
                                 *(undefined1 (*) [16])
                                  ((patch->ring).items[3].crease_weight.data + uVar26));
        auVar93 = auVar48._0_16_;
        auVar47 = vcmpps_avx(ZEXT816(0) << 0x40,auVar47,1);
        auVar66 = vshufps_avx(auVar47,auVar47,0xd4);
        auVar47 = vshufps_avx(auVar47,auVar47,0xfa);
        auVar47 = vandps_avx(auVar14,auVar47);
        auVar37 = auVar48._16_16_;
        auVar56 = vpaddq_avx(auVar37,auVar47);
        auVar47 = vandps_avx(auVar14,auVar66);
        auVar47 = vpaddq_avx(auVar93,auVar47);
        auVar48 = ZEXT3264(CONCAT1616(auVar56,auVar47));
        uVar26 = uVar26 + 4;
      } while ((uVar21 + 3 & 0x1fffffffc) != uVar26);
      auVar66 = vpcmpgtq_avx(auVar15 ^ auVar67._0_16_,auVar15 ^ auVar36);
      auVar36 = vblendvpd_avx(auVar56,auVar37,auVar62);
      auVar47 = vblendvpd_avx(auVar47,auVar93,auVar66);
      auVar36 = vpaddq_avx(auVar47,auVar36);
      auVar47 = vpshufd_avx(auVar36,0xee);
      auVar36 = vpaddq_avx(auVar36,auVar47);
      uVar21 = auVar36._0_8_;
    }
    iVar6 = (patch->ring).items[3].border_index;
    bVar34 = uVar21 == (uint)(iVar6 != -1) * 2;
    bVar19 = true;
    bVar16 = bVar34;
    bVar33 = bVar19;
    if (uVar5 == 2 && iVar6 != -1) {
      fVar60 = (patch->ring).items[3].vertex_crease_weight;
      if (((fVar60 != 0.0) || (NAN(fVar60))) && (fVar60 < INFINITY)) {
        bVar16 = false;
        bVar33 = false;
      }
    }
    else {
      fVar60 = (patch->ring).items[3].vertex_crease_weight;
      bVar16 = false;
      bVar33 = false;
      if (((fVar60 == 0.0) && (!NAN(fVar60))) &&
         (bVar16 = bVar34, bVar33 = bVar19, uVar5 != 3 || iVar6 == -1)) {
        bVar16 = (uVar5 == 4 && iVar6 == -1) && bVar34;
        bVar33 = uVar5 == 4 && iVar6 == -1;
      }
    }
    fVar60 = local_34f0._0_4_;
    if (depth < 10) {
      if ((bool)(bVar18 & bVar28 & bVar17 & bVar16)) {
        in_ZMM10 = ZEXT1664(auVar88);
        BSplinePatchT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>::init
                  ((BSplinePatchT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_> *)&local_3480,
                   (EVP_PKEY_CTX *)patch);
        BSplinePatchT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>::eval
                  ((BSplinePatchT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_> *)&local_3480,
                   (uv->field_0).field_0.x,(uv->field_0).field_0.y,this->P,this->dPdu,this->dPdv,
                   this->ddPdudu,this->ddPdvdv,this->ddPdudv,fVar60);
        bVar28 = false;
      }
      else {
        plVar22 = local_3180;
        lVar23 = 0;
        do {
          lVar24 = 0xd00;
          plVar27 = plVar22;
          do {
            plVar27[-0x50] = (long)(plVar27 + -0x58);
            plVar27[-0x47] = 0;
            *plVar27 = (long)(plVar27 + -0x40);
            plVar27 = plVar27 + 0x68;
            lVar24 = lVar24 + -0x340;
          } while (lVar24 != 0);
          lVar23 = lVar23 + 0xd00;
          plVar22 = plVar22 + 0x1a0;
        } while (lVar23 != 0x3400);
        in_ZMM10 = ZEXT1664(auVar88);
        CatmullClarkPatchT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>::subdivide
                  (patch,(array_t<embree::CatmullClarkPatchT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>,_4UL>
                          *)&local_3480);
        aVar3 = (uv->field_0).field_0;
        auVar46._8_8_ = 0;
        auVar46._0_4_ = aVar3.x;
        auVar46._4_4_ = aVar3.y;
        auVar88 = vmovshdup_avx(auVar46);
        fVar52 = auVar88._0_4_;
        fVar44 = aVar3.x;
        local_3540._4_4_ = aVar3.y;
        if (0.5 <= fVar52) {
          if (fVar44 <= 0.5) {
            lVar23 = 0;
            do {
              uVar13 = *(undefined8 *)((long)local_d80 + lVar23 + 8);
              puVar1 = (undefined8 *)
                       ((long)(patch->ring).items[0].crease_weight.arr + lVar23 + -0x40);
              *puVar1 = *(undefined8 *)((long)local_d80 + lVar23);
              puVar1[1] = uVar13;
              DynamicStackArray<float,_16UL,_64UL>::operator=
                        ((DynamicStackArray<float,_16UL,_64UL> *)(puVar1 + 8),
                         (DynamicStackArray<float,_16UL,_64UL> *)((long)DStack_d40.arr + lVar23));
              uVar13 = *(undefined8 *)((long)local_cc0 + lVar23 + 8);
              pDVar2 = (DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *)
                       ((long)&(patch->ring).items[0].ring.arr[0].field_0 + lVar23);
              pDVar2[-1].data = *(vfloat_impl<4> **)((long)local_cc0 + lVar23);
              *(undefined8 *)&pDVar2[-1].field_0x208 = uVar13;
              uVar13 = *(undefined8 *)((long)local_cc0 + lVar23 + 0x18);
              *(undefined8 *)&pDVar2[-1].field_0x210 =
                   *(undefined8 *)((long)local_cc0 + lVar23 + 0x10);
              *(undefined8 *)&pDVar2[-1].field_0x218 = uVar13;
              DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL>::operator=
                        (pDVar2,(DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *)
                                ((long)&aDStack_c80[0].arr[0].field_0 + lVar23));
              lVar23 = lVar23 + 0x340;
            } while (lVar23 != 0xd00);
            fVar44 = fVar44 + fVar44;
            fVar52 = fVar52 + fVar52 + -1.0;
            goto LAB_015ddd40;
          }
          lVar23 = 0;
          do {
            uVar13 = *(undefined8 *)((long)local_1a80 + lVar23 + 8);
            puVar1 = (undefined8 *)((long)(patch->ring).items[0].crease_weight.arr + lVar23 + -0x40)
            ;
            *puVar1 = *(undefined8 *)((long)local_1a80 + lVar23);
            puVar1[1] = uVar13;
            DynamicStackArray<float,_16UL,_64UL>::operator=
                      ((DynamicStackArray<float,_16UL,_64UL> *)(puVar1 + 8),
                       (DynamicStackArray<float,_16UL,_64UL> *)((long)DStack_1a40.arr + lVar23));
            uVar13 = *(undefined8 *)((long)local_19c0 + lVar23 + 8);
            pDVar2 = (DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *)
                     ((long)&(patch->ring).items[0].ring.arr[0].field_0 + lVar23);
            pDVar2[-1].data = *(vfloat_impl<4> **)((long)local_19c0 + lVar23);
            *(undefined8 *)&pDVar2[-1].field_0x208 = uVar13;
            uVar13 = *(undefined8 *)((long)local_19c0 + lVar23 + 0x18);
            *(undefined8 *)&pDVar2[-1].field_0x210 =
                 *(undefined8 *)((long)local_19c0 + lVar23 + 0x10);
            *(undefined8 *)&pDVar2[-1].field_0x218 = uVar13;
            DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL>::operator=
                      (pDVar2,(DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *)
                              ((long)&aDStack_1980[0].arr[0].field_0 + lVar23));
            lVar23 = lVar23 + 0x340;
          } while (lVar23 != 0xd00);
          auVar40._0_4_ = fVar44 + fVar44 + -1.0;
          auVar40._4_4_ = local_3540._4_4_ + local_3540._4_4_ + -1.0;
          auVar40._8_4_ = 0xbf800000;
          auVar40._12_4_ = 0xbf800000;
        }
        else if (0.5 <= fVar44) {
          lVar23 = 0;
          do {
            uVar13 = *(undefined8 *)((long)local_2780 + lVar23 + 8);
            puVar1 = (undefined8 *)((long)(patch->ring).items[0].crease_weight.arr + lVar23 + -0x40)
            ;
            *puVar1 = *(undefined8 *)((long)local_2780 + lVar23);
            puVar1[1] = uVar13;
            DynamicStackArray<float,_16UL,_64UL>::operator=
                      ((DynamicStackArray<float,_16UL,_64UL> *)(puVar1 + 8),
                       (DynamicStackArray<float,_16UL,_64UL> *)((long)DStack_2740.arr + lVar23));
            uVar13 = *(undefined8 *)((long)local_26c0 + lVar23 + 8);
            pDVar2 = (DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *)
                     ((long)&(patch->ring).items[0].ring.arr[0].field_0 + lVar23);
            pDVar2[-1].data = *(vfloat_impl<4> **)((long)local_26c0 + lVar23);
            *(undefined8 *)&pDVar2[-1].field_0x208 = uVar13;
            uVar13 = *(undefined8 *)((long)local_26c0 + lVar23 + 0x18);
            *(undefined8 *)&pDVar2[-1].field_0x210 =
                 *(undefined8 *)((long)local_26c0 + lVar23 + 0x10);
            *(undefined8 *)&pDVar2[-1].field_0x218 = uVar13;
            DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL>::operator=
                      (pDVar2,(DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *)
                              ((long)&aDStack_2680[0].arr[0].field_0 + lVar23));
            lVar23 = lVar23 + 0x340;
          } while (lVar23 != 0xd00);
          fVar44 = fVar44 + fVar44 + -1.0;
          fVar52 = fVar52 + fVar52;
LAB_015ddd40:
          auVar40 = vinsertps_avx(ZEXT416((uint)fVar44),ZEXT416((uint)fVar52),0x10);
        }
        else {
          lVar23 = 0;
          do {
            uVar13 = *(undefined8 *)((long)&local_3480 + lVar23 + 8);
            puVar1 = (undefined8 *)((long)(patch->ring).items[0].crease_weight.arr + lVar23 + -0x40)
            ;
            *puVar1 = *(undefined8 *)((long)&local_3480 + lVar23);
            puVar1[1] = uVar13;
            DynamicStackArray<float,_16UL,_64UL>::operator=
                      ((DynamicStackArray<float,_16UL,_64UL> *)(puVar1 + 8),
                       (DynamicStackArray<float,_16UL,_64UL> *)((long)&local_3440 + lVar23));
            uVar13 = *(undefined8 *)((long)&local_33c0 + lVar23 + 8);
            puVar1 = (undefined8 *)((long)((patch->ring).items[0].ring.arr + -4) + lVar23);
            *puVar1 = *(undefined8 *)((long)&local_33c0 + lVar23);
            puVar1[1] = uVar13;
            uVar13 = *(undefined8 *)((long)&local_33b0 + lVar23 + 8);
            puVar1 = (undefined8 *)((long)((patch->ring).items[0].ring.arr + -3) + lVar23);
            *puVar1 = *(undefined8 *)((long)&local_33b0 + lVar23);
            puVar1[1] = uVar13;
            DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL>::operator=
                      ((DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *)
                       ((long)&(patch->ring).items[0].ring.arr[0].field_0 + lVar23),
                       (DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *)
                       ((long)&local_3380 + lVar23));
            lVar23 = lVar23 + 0x340;
          } while (lVar23 != 0xd00);
          auVar40._0_4_ = fVar44 + fVar44;
          auVar40._4_4_ = local_3540._4_4_ + local_3540._4_4_;
          auVar40._8_8_ = 0;
        }
        aVar4 = (anon_union_8_2_4062524c_for_Vec2<float>_1)vmovlps_avx(auVar40);
        uv->field_0 = aVar4;
        local_34f0 = ZEXT416((uint)(fVar60 + fVar60));
        depth = depth + 1;
        puVar30 = local_380;
        paVar29 = local_80;
        do {
          paVar29 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(paVar29->v + -0x340);
          lVar23 = -0xd00;
          puVar25 = puVar30;
          do {
            puVar7 = *(undefined1 **)(puVar25 + 0x2c0);
            if (puVar7 != (undefined1 *)0x0 && puVar25 + 0xc0 != puVar7) {
              alignedFree(puVar7);
            }
            puVar7 = *(undefined1 **)(puVar25 + 0x40);
            if (puVar7 != (undefined1 *)0x0 && puVar25 != puVar7) {
              operator_delete__(puVar7);
            }
            puVar25 = puVar25 + -0x340;
            lVar23 = lVar23 + 0x340;
          } while (lVar23 != 0);
          puVar30 = puVar30 + -0xd00;
        } while (paVar29 != &local_3480);
        bVar28 = true;
      }
    }
    else {
      if ((bool)(bVar31 & bVar20 & bVar32 & bVar33)) {
        in_ZMM10 = ZEXT1664(auVar88);
        BSplinePatchT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>::init
                  ((BSplinePatchT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_> *)&local_3480,
                   (EVP_PKEY_CTX *)patch);
        BSplinePatchT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>::eval
                  ((BSplinePatchT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_> *)&local_3480,
                   (uv->field_0).field_0.x,(uv->field_0).field_0.y,this->P,this->dPdu,this->dPdv,
                   this->ddPdudu,this->ddPdvdv,this->ddPdudv,fVar60);
      }
      else {
        in_ZMM10 = ZEXT1664(auVar88);
        GregoryPatchT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>::init_crackfix
                  ((GregoryPatchT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_> *)&local_3480,
                   patch,border0,border1,border2,border3);
        fVar44 = (uv->field_0).field_0.x;
        fVar52 = (uv->field_0).field_0.y;
        pvVar8 = this->dPdu;
        paVar29 = &this->dPdv->field_0;
        pvVar9 = this->ddPdudu;
        pvVar10 = this->ddPdvdv;
        pvVar11 = this->ddPdudv;
        auVar88 = ZEXT416((uint)fVar52);
        auVar36 = ZEXT416((uint)fVar44);
        if (&this->P->field_0 != (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)0x0) {
          if ((((fVar52 == 1.0) && (!NAN(fVar52))) ||
              (((fVar44 == 0.0 && (!NAN(fVar44))) || ((fVar44 == 1.0 && (!NAN(fVar44))))))) ||
             ((fVar52 == 0.0 && (!NAN(fVar52))))) {
            local_3540._4_4_ = fStack_342c;
            local_3540._0_4_ = local_3430;
            uStack_3538._4_4_ = fStack_3424;
            uStack_3538._0_4_ = fStack_3428;
            fVar59 = local_3420;
            fVar71 = fStack_341c;
            fVar74 = fStack_3418;
            fVar77 = fStack_3414;
            fVar35 = local_33e0;
            fVar41 = fStack_33dc;
            fVar42 = fStack_33d8;
            fVar43 = fStack_33d4;
            fVar45 = local_33f0;
            fVar49 = fStack_33ec;
            fVar50 = fStack_33e8;
            fVar51 = fStack_33e4;
          }
          else {
            auVar56 = vshufps_avx(auVar36,auVar36,0);
            auVar62 = vshufps_avx(auVar88,auVar88,0);
            fVar59 = fVar44 + fVar52;
            auVar47 = vrcpss_avx(ZEXT416((uint)fVar59),ZEXT416((uint)fVar59));
            auVar47 = ZEXT416((uint)(auVar47._0_4_ * (2.0 - fVar59 * auVar47._0_4_)));
            auVar47 = vshufps_avx(auVar47,auVar47,0);
            local_3540._4_4_ =
                 (auVar56._4_4_ * fStack_342c + auVar62._4_4_ * local_3380.v[1]) * auVar47._4_4_;
            local_3540._0_4_ =
                 (auVar56._0_4_ * local_3430 + auVar62._0_4_ * local_3380.v[0]) * auVar47._0_4_;
            uStack_3538._0_4_ =
                 (auVar56._8_4_ * fStack_3428 + auVar62._8_4_ * local_3380.v[2]) * auVar47._8_4_;
            uStack_3538._4_4_ =
                 (auVar56._12_4_ * fStack_3424 + auVar62._12_4_ * local_3380.v[3]) * auVar47._12_4_;
            fVar59 = 1.0 - fVar44;
            auVar66 = vshufps_avx(ZEXT416((uint)fVar59),ZEXT416((uint)fVar59),0);
            fVar59 = fVar59 + fVar52;
            auVar47 = vrcpss_avx(ZEXT416((uint)fVar59),ZEXT416((uint)fVar59));
            auVar47 = ZEXT416((uint)(auVar47._0_4_ * (2.0 - fVar59 * auVar47._0_4_)));
            auVar93 = vshufps_avx(auVar47,auVar47,0);
            auVar37 = vshufps_avx(ZEXT416((uint)(1.0 - fVar52)),ZEXT416((uint)(1.0 - fVar52)),0);
            fVar59 = (2.0 - fVar44) - fVar52;
            auVar47 = vrcpss_avx(ZEXT416((uint)fVar59),ZEXT416((uint)fVar59));
            auVar47 = ZEXT416((uint)(auVar47._0_4_ * (2.0 - auVar47._0_4_ * fVar59)));
            auVar63 = vshufps_avx(auVar47,auVar47,0);
            fVar59 = (fVar44 + 1.0) - fVar52;
            auVar47 = vrcpss_avx(ZEXT416((uint)fVar59),ZEXT416((uint)fVar59));
            auVar47 = ZEXT416((uint)(auVar47._0_4_ * (2.0 - fVar59 * auVar47._0_4_)));
            auVar47 = vshufps_avx(auVar47,auVar47,0);
            fVar59 = (auVar62._0_4_ * local_3420 + auVar66._0_4_ * local_3370) * auVar93._0_4_;
            fVar71 = (auVar62._4_4_ * fStack_341c + auVar66._4_4_ * fStack_336c) * auVar93._4_4_;
            fVar74 = (auVar62._8_4_ * fStack_3418 + auVar66._8_4_ * fStack_3368) * auVar93._8_4_;
            fVar77 = (auVar62._12_4_ * fStack_3414 + auVar66._12_4_ * fStack_3364) * auVar93._12_4_;
            fVar35 = (auVar66._0_4_ * local_33e0 + auVar37._0_4_ * local_3350) * auVar63._0_4_;
            fVar41 = (auVar66._4_4_ * fStack_33dc + auVar37._4_4_ * fStack_334c) * auVar63._4_4_;
            fVar42 = (auVar66._8_4_ * fStack_33d8 + auVar37._8_4_ * fStack_3348) * auVar63._8_4_;
            fVar43 = (auVar66._12_4_ * fStack_33d4 + auVar37._12_4_ * fStack_3344) * auVar63._12_4_;
            fVar45 = (auVar56._0_4_ * local_3360 + auVar37._0_4_ * local_33f0) * auVar47._0_4_;
            fVar49 = (auVar56._4_4_ * fStack_335c + auVar37._4_4_ * fStack_33ec) * auVar47._4_4_;
            fVar50 = (auVar56._8_4_ * fStack_3358 + auVar37._8_4_ * fStack_33e8) * auVar47._8_4_;
            fVar51 = (auVar56._12_4_ * fStack_3354 + auVar37._12_4_ * fStack_33e4) * auVar47._12_4_;
          }
          fVar87 = 1.0 - fVar44;
          fVar81 = 1.0 - fVar52;
          auVar47 = ZEXT416((uint)(fVar87 * fVar87 * fVar87));
          auVar47 = vshufps_avx(auVar47,auVar47,0);
          auVar56 = ZEXT416((uint)(fVar44 * 3.0 * fVar87 * fVar87));
          auVar56 = vshufps_avx(auVar56,auVar56,0);
          auVar62 = ZEXT416((uint)(fVar44 * fVar44 * fVar44));
          auVar62 = vshufps_avx(auVar62,auVar62,0);
          fVar61 = auVar62._0_4_;
          fVar73 = auVar62._4_4_;
          fVar76 = auVar62._8_4_;
          fVar79 = auVar62._12_4_;
          auVar62 = ZEXT416((uint)(fVar44 * fVar44 * 3.0 * fVar87));
          auVar62 = vshufps_avx(auVar62,auVar62,0);
          fVar83 = auVar62._0_4_;
          fVar84 = auVar62._4_4_;
          fVar85 = auVar62._8_4_;
          fVar86 = auVar62._12_4_;
          fVar75 = auVar56._0_4_;
          fVar78 = auVar56._4_4_;
          fVar57 = auVar56._8_4_;
          fVar58 = auVar56._12_4_;
          fVar87 = auVar47._0_4_;
          fVar53 = auVar47._4_4_;
          fVar80 = auVar47._8_4_;
          fVar72 = auVar47._12_4_;
          auVar47 = ZEXT416((uint)(fVar81 * fVar81 * fVar81));
          auVar47 = vshufps_avx(auVar47,auVar47,0);
          fVar89 = auVar47._0_4_ *
                   (fVar75 * local_3470 + fVar61 * local_3450 + fVar83 * local_3460 +
                   fVar87 * local_3480.v[0]);
          fVar90 = auVar47._4_4_ *
                   (fVar78 * fStack_346c + fVar73 * fStack_344c + fVar84 * fStack_345c +
                   fVar53 * local_3480.v[1]);
          fVar91 = auVar47._8_4_ *
                   (fVar57 * fStack_3468 + fVar76 * fStack_3448 + fVar85 * fStack_3458 +
                   fVar80 * local_3480.v[2]);
          fVar92 = auVar47._12_4_ *
                   (fVar58 * fStack_3464 + fVar79 * fStack_3444 + fVar86 * fStack_3454 +
                   fVar72 * local_3480.v[3]);
          in_ZMM10 = ZEXT1664(CONCAT412(fVar92,CONCAT48(fVar91,CONCAT44(fVar90,fVar89))));
          auVar47 = ZEXT416((uint)(fVar52 * 3.0 * fVar81 * fVar81));
          auVar47 = vshufps_avx(auVar47,auVar47,0);
          auVar56 = ZEXT416((uint)(fVar52 * fVar52 * 3.0 * fVar81));
          auVar56 = vshufps_avx(auVar56,auVar56,0);
          auVar62 = ZEXT416((uint)(fVar52 * fVar52 * fVar52));
          auVar62 = vshufps_avx(auVar62,auVar62,0);
          vVar54.field_0._0_4_ =
               fVar89 + auVar47._0_4_ *
                        (fVar87 * local_3440.v[0] +
                        fVar75 * (float)local_3540 + fVar83 * fVar59 + fVar61 * local_3410) +
                        auVar56._0_4_ *
                        (fVar87 * local_3400 +
                        fVar75 * fVar45 + fVar83 * fVar35 + fVar61 * local_33d0) +
                        auVar62._0_4_ *
                        (fVar87 * local_33c0.v[0] +
                        fVar75 * local_33b0.v[0] + fVar61 * local_3390 + fVar83 * local_33a0);
          vVar54.field_0._4_4_ =
               fVar90 + auVar47._4_4_ *
                        (fVar53 * local_3440.v[1] +
                        fVar78 * local_3540._4_4_ + fVar84 * fVar71 + fVar73 * fStack_340c) +
                        auVar56._4_4_ *
                        (fVar53 * fStack_33fc +
                        fVar78 * fVar49 + fVar84 * fVar41 + fVar73 * fStack_33cc) +
                        auVar62._4_4_ *
                        (fVar53 * local_33c0.v[1] +
                        fVar78 * local_33b0.v[1] + fVar73 * fStack_338c + fVar84 * fStack_339c);
          vVar54.field_0._8_4_ =
               fVar91 + auVar47._8_4_ *
                        (fVar80 * local_3440.v[2] +
                        fVar57 * (float)uStack_3538 + fVar85 * fVar74 + fVar76 * fStack_3408) +
                        auVar56._8_4_ *
                        (fVar80 * fStack_33f8 +
                        fVar57 * fVar50 + fVar85 * fVar42 + fVar76 * fStack_33c8) +
                        auVar62._8_4_ *
                        (fVar80 * local_33c0.v[2] +
                        fVar57 * local_33b0.v[2] + fVar76 * fStack_3388 + fVar85 * fStack_3398);
          vVar54.field_0._12_4_ =
               fVar92 + auVar47._12_4_ *
                        (fVar72 * local_3440.v[3] +
                        fVar58 * uStack_3538._4_4_ + fVar86 * fVar77 + fVar79 * fStack_3404) +
                        auVar56._12_4_ *
                        (fVar72 * fStack_33f4 +
                        fVar58 * fVar51 + fVar86 * fVar43 + fVar79 * fStack_33c4) +
                        auVar62._12_4_ *
                        (fVar72 * local_33c0.v[3] +
                        fVar58 * local_33b0.v[3] + fVar79 * fStack_3384 + fVar86 * fStack_3394);
          this->P->field_0 = vVar54.field_0;
        }
        if (pvVar8 != (vfloat_impl<4> *)0x0) {
          auVar47 = vcmpps_avx(SUB6416(ZEXT464(0x3f800000),0),auVar36,0);
          auVar56 = vcmpps_avx(auVar36,ZEXT816(0) << 0x40,0);
          auVar47 = vorps_avx(auVar56,auVar47);
          bVar28 = fVar52 == 1.0 || fVar52 == 0.0;
          if (bVar28 || (auVar47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            local_3500._4_4_ = fStack_33ec;
            local_3500._0_4_ = local_33f0;
            uStack_34f8._4_4_ = fStack_33e4;
            uStack_34f8._0_4_ = fStack_33e8;
            local_3540._4_4_ = fStack_33dc;
            local_3540._0_4_ = local_33e0;
            uStack_3538._4_4_ = fStack_33d4;
            uStack_3538._0_4_ = fStack_33d8;
            fVar59 = local_3420;
            fVar71 = fStack_341c;
            fVar74 = fStack_3418;
            fVar77 = fStack_3414;
            fVar35 = local_3430;
            fVar41 = fStack_342c;
            fVar42 = fStack_3428;
            fVar43 = fStack_3424;
          }
          else {
            auVar62 = vshufps_avx(auVar36,auVar36,0);
            auVar66 = vshufps_avx(auVar88,auVar88,0);
            fVar59 = fVar44 + fVar52;
            auVar56 = vrcpss_avx(ZEXT416((uint)fVar59),ZEXT416((uint)fVar59));
            auVar56 = ZEXT416((uint)(auVar56._0_4_ * (2.0 - fVar59 * auVar56._0_4_)));
            auVar93 = vshufps_avx(auVar56,auVar56,0);
            fVar59 = 1.0 - fVar44;
            auVar37 = vshufps_avx(ZEXT416((uint)fVar59),ZEXT416((uint)fVar59),0);
            fVar59 = fVar59 + fVar52;
            auVar56 = vrcpss_avx(ZEXT416((uint)fVar59),ZEXT416((uint)fVar59));
            auVar56 = ZEXT416((uint)(auVar56._0_4_ * (2.0 - fVar59 * auVar56._0_4_)));
            auVar63 = vshufps_avx(auVar56,auVar56,0);
            auVar82 = vshufps_avx(ZEXT416((uint)(1.0 - fVar52)),ZEXT416((uint)(1.0 - fVar52)),0);
            fVar59 = (2.0 - fVar44) - fVar52;
            auVar56 = vrcpss_avx(ZEXT416((uint)fVar59),ZEXT416((uint)fVar59));
            auVar56 = ZEXT416((uint)(auVar56._0_4_ * (2.0 - fVar59 * auVar56._0_4_)));
            auVar56 = vshufps_avx(auVar56,auVar56,0);
            local_3540._4_4_ =
                 (auVar37._4_4_ * fStack_33dc + auVar82._4_4_ * fStack_334c) * auVar56._4_4_;
            local_3540._0_4_ =
                 (auVar37._0_4_ * local_33e0 + auVar82._0_4_ * local_3350) * auVar56._0_4_;
            uStack_3538._0_4_ =
                 (auVar37._8_4_ * fStack_33d8 + auVar82._8_4_ * fStack_3348) * auVar56._8_4_;
            uStack_3538._4_4_ =
                 (auVar37._12_4_ * fStack_33d4 + auVar82._12_4_ * fStack_3344) * auVar56._12_4_;
            fVar59 = (fVar44 + 1.0) - fVar52;
            auVar56 = vrcpss_avx(ZEXT416((uint)fVar59),ZEXT416((uint)fVar59));
            auVar56 = ZEXT416((uint)(auVar56._0_4_ * (2.0 - fVar59 * auVar56._0_4_)));
            auVar56 = vshufps_avx(auVar56,auVar56,0);
            local_3500._4_4_ =
                 (auVar82._4_4_ * fStack_33ec + auVar62._4_4_ * fStack_335c) * auVar56._4_4_;
            local_3500._0_4_ =
                 (auVar82._0_4_ * local_33f0 + auVar62._0_4_ * local_3360) * auVar56._0_4_;
            uStack_34f8._0_4_ =
                 (auVar82._8_4_ * fStack_33e8 + auVar62._8_4_ * fStack_3358) * auVar56._8_4_;
            uStack_34f8._4_4_ =
                 (auVar82._12_4_ * fStack_33e4 + auVar62._12_4_ * fStack_3354) * auVar56._12_4_;
            fVar59 = (auVar66._0_4_ * local_3420 + auVar37._0_4_ * local_3370) * auVar63._0_4_;
            fVar71 = (auVar66._4_4_ * fStack_341c + auVar37._4_4_ * fStack_336c) * auVar63._4_4_;
            fVar74 = (auVar66._8_4_ * fStack_3418 + auVar37._8_4_ * fStack_3368) * auVar63._8_4_;
            fVar77 = (auVar66._12_4_ * fStack_3414 + auVar37._12_4_ * fStack_3364) * auVar63._12_4_;
            fVar35 = (auVar62._0_4_ * local_3430 + auVar66._0_4_ * local_3380.v[0]) * auVar93._0_4_;
            fVar41 = (auVar62._4_4_ * fStack_342c + auVar66._4_4_ * local_3380.v[1]) * auVar93._4_4_
            ;
            fVar42 = (auVar62._8_4_ * fStack_3428 + auVar66._8_4_ * local_3380.v[2]) * auVar93._8_4_
            ;
            fVar43 = (auVar62._12_4_ * fStack_3424 + auVar66._12_4_ * local_3380.v[3]) *
                     auVar93._12_4_;
          }
          fVar81 = 1.0 - fVar44;
          fVar49 = fVar81 * fVar81;
          fVar45 = fVar44 * fVar81 + fVar44 * fVar81;
          fVar50 = fVar44 * fVar44;
          fVar51 = fVar50 * 3.0;
          fVar53 = 1.0 - fVar52;
          fVar87 = fVar53 * fVar53;
          auVar56 = ZEXT416((uint)((fVar45 - fVar50) * 3.0));
          auVar56 = vshufps_avx(auVar56,auVar56,0);
          auVar62 = vshufps_avx(ZEXT416((uint)fVar51),ZEXT416((uint)fVar51),0);
          fVar57 = auVar62._0_4_;
          fVar58 = auVar62._4_4_;
          fVar89 = auVar62._8_4_;
          fVar90 = auVar62._12_4_;
          fVar91 = auVar56._0_4_;
          fVar92 = auVar56._4_4_;
          fVar61 = auVar56._8_4_;
          fVar73 = auVar56._12_4_;
          auVar56 = ZEXT416((uint)((fVar49 - fVar45) * 3.0));
          auVar56 = vshufps_avx(auVar56,auVar56,0);
          fVar76 = auVar56._0_4_;
          fVar79 = auVar56._4_4_;
          fVar83 = auVar56._8_4_;
          fVar84 = auVar56._12_4_;
          auVar56 = vshufps_avx(ZEXT416((uint)(fVar49 * -3.0)),ZEXT416((uint)(fVar49 * -3.0)),0);
          fVar80 = auVar56._0_4_;
          fVar72 = auVar56._4_4_;
          fVar75 = auVar56._8_4_;
          fVar78 = auVar56._12_4_;
          auVar56 = vshufps_avx(ZEXT416((uint)(fVar53 * fVar87)),ZEXT416((uint)(fVar53 * fVar87)),0)
          ;
          fVar45 = fVar52 * fVar52;
          auVar62 = ZEXT416((uint)(fVar52 * 3.0 * fVar87));
          auVar62 = vshufps_avx(auVar62,auVar62,0);
          auVar66 = ZEXT416((uint)(fVar53 * fVar45 * 3.0));
          auVar66 = vshufps_avx(auVar66,auVar66,0);
          auVar93 = vshufps_avx(ZEXT416((uint)(fVar45 * fVar52)),ZEXT416((uint)(fVar45 * fVar52)),0)
          ;
          auVar37 = vpermilps_avx(local_34f0,0);
          (pvVar8->field_0).v[0] =
               auVar37._0_4_ *
               (auVar56._0_4_ *
                (fVar80 * local_3480.v[0] +
                fVar76 * local_3470 + fVar57 * local_3450 + fVar91 * local_3460) +
               auVar62._0_4_ *
               (fVar80 * local_3440.v[0] + fVar76 * fVar35 + fVar91 * fVar59 + fVar57 * local_3410)
               + auVar66._0_4_ *
                 (fVar80 * local_3400 +
                 fVar76 * (float)local_3500 + fVar91 * (float)local_3540 + fVar57 * local_33d0) +
                 auVar93._0_4_ *
                 (fVar76 * local_33b0.v[0] + fVar57 * local_3390 + fVar91 * local_33a0 +
                 fVar80 * local_33c0.v[0]));
          (pvVar8->field_0).v[1] =
               auVar37._4_4_ *
               (auVar56._4_4_ *
                (fVar72 * local_3480.v[1] +
                fVar79 * fStack_346c + fVar58 * fStack_344c + fVar92 * fStack_345c) +
               auVar62._4_4_ *
               (fVar72 * local_3440.v[1] + fVar79 * fVar41 + fVar92 * fVar71 + fVar58 * fStack_340c)
               + auVar66._4_4_ *
                 (fVar72 * fStack_33fc +
                 fVar79 * local_3500._4_4_ + fVar92 * local_3540._4_4_ + fVar58 * fStack_33cc) +
                 auVar93._4_4_ *
                 (fVar79 * local_33b0.v[1] + fVar58 * fStack_338c + fVar92 * fStack_339c +
                 fVar72 * local_33c0.v[1]));
          (pvVar8->field_0).v[2] =
               auVar37._8_4_ *
               (auVar56._8_4_ *
                (fVar75 * local_3480.v[2] +
                fVar83 * fStack_3468 + fVar89 * fStack_3448 + fVar61 * fStack_3458) +
               auVar62._8_4_ *
               (fVar75 * local_3440.v[2] + fVar83 * fVar42 + fVar61 * fVar74 + fVar89 * fStack_3408)
               + auVar66._8_4_ *
                 (fVar75 * fStack_33f8 +
                 fVar83 * (float)uStack_34f8 + fVar61 * (float)uStack_3538 + fVar89 * fStack_33c8) +
                 auVar93._8_4_ *
                 (fVar83 * local_33b0.v[2] + fVar89 * fStack_3388 + fVar61 * fStack_3398 +
                 fVar75 * local_33c0.v[2]));
          (pvVar8->field_0).v[3] =
               auVar37._12_4_ *
               (auVar56._12_4_ *
                (fVar78 * local_3480.v[3] +
                fVar84 * fStack_3464 + fVar90 * fStack_3444 + fVar73 * fStack_3454) +
               auVar62._12_4_ *
               (fVar78 * local_3440.v[3] + fVar84 * fVar43 + fVar73 * fVar77 + fVar90 * fStack_3404)
               + auVar66._12_4_ *
                 (fVar78 * fStack_33f4 +
                 fVar84 * uStack_34f8._4_4_ + fVar73 * uStack_3538._4_4_ + fVar90 * fStack_33c4) +
                 auVar93._12_4_ *
                 (fVar84 * local_33b0.v[3] + fVar90 * fStack_3384 + fVar73 * fStack_3394 +
                 fVar78 * local_33c0.v[3]));
          if (bVar28 || (auVar47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            auVar97._4_4_ = fStack_33ec;
            auVar97._0_4_ = local_33f0;
            auVar97._8_4_ = fStack_33e8;
            auVar97._12_4_ = fStack_33e4;
            fVar59 = local_3430;
            fVar71 = fStack_342c;
            fVar74 = fStack_3428;
            fVar77 = fStack_3424;
            fVar35 = local_3420;
            fVar41 = fStack_341c;
            fVar42 = fStack_3418;
            fVar43 = fStack_3414;
            fVar80 = local_33e0;
            fVar72 = fStack_33dc;
            fVar75 = fStack_33d8;
            fVar78 = fStack_33d4;
          }
          else {
            auVar56 = vshufps_avx(auVar36,auVar36,0);
            auVar62 = vshufps_avx(auVar88,auVar88,0);
            fVar59 = fVar44 + fVar52;
            auVar47 = vrcpss_avx(ZEXT416((uint)fVar59),ZEXT416((uint)fVar59));
            auVar47 = ZEXT416((uint)(auVar47._0_4_ * (2.0 - fVar59 * auVar47._0_4_)));
            auVar66 = vshufps_avx(auVar47,auVar47,0);
            auVar93 = vshufps_avx(ZEXT416((uint)fVar81),ZEXT416((uint)fVar81),0);
            fVar59 = fVar81 + fVar52;
            auVar47 = vrcpss_avx(ZEXT416((uint)fVar59),ZEXT416((uint)fVar59));
            auVar47 = ZEXT416((uint)(auVar47._0_4_ * (2.0 - fVar59 * auVar47._0_4_)));
            auVar63 = vshufps_avx(auVar47,auVar47,0);
            auVar82 = vshufps_avx(ZEXT416((uint)fVar53),ZEXT416((uint)fVar53),0);
            fVar59 = (2.0 - fVar44) - fVar52;
            auVar47 = vrcpss_avx(ZEXT416((uint)fVar59),ZEXT416((uint)fVar59));
            auVar47 = ZEXT416((uint)(auVar47._0_4_ * (2.0 - fVar59 * auVar47._0_4_)));
            auVar12 = vshufps_avx(auVar47,auVar47,0);
            fVar59 = (fVar44 + 1.0) - fVar52;
            auVar47 = vrcpss_avx(ZEXT416((uint)fVar59),ZEXT416((uint)fVar59));
            auVar47 = ZEXT416((uint)(auVar47._0_4_ * (2.0 - fVar59 * auVar47._0_4_)));
            auVar47 = vshufps_avx(auVar47,auVar47,0);
            auVar97._0_4_ =
                 auVar47._0_4_ * (auVar82._0_4_ * local_33f0 + auVar56._0_4_ * local_3360);
            auVar97._4_4_ =
                 auVar47._4_4_ * (auVar82._4_4_ * fStack_33ec + auVar56._4_4_ * fStack_335c);
            auVar97._8_4_ =
                 auVar47._8_4_ * (auVar82._8_4_ * fStack_33e8 + auVar56._8_4_ * fStack_3358);
            auVar97._12_4_ =
                 auVar47._12_4_ * (auVar82._12_4_ * fStack_33e4 + auVar56._12_4_ * fStack_3354);
            fVar59 = (auVar56._0_4_ * local_3430 + auVar62._0_4_ * local_3380.v[0]) * auVar66._0_4_;
            fVar71 = (auVar56._4_4_ * fStack_342c + auVar62._4_4_ * local_3380.v[1]) * auVar66._4_4_
            ;
            fVar74 = (auVar56._8_4_ * fStack_3428 + auVar62._8_4_ * local_3380.v[2]) * auVar66._8_4_
            ;
            fVar77 = (auVar56._12_4_ * fStack_3424 + auVar62._12_4_ * local_3380.v[3]) *
                     auVar66._12_4_;
            fVar35 = (auVar62._0_4_ * local_3420 + auVar93._0_4_ * local_3370) * auVar63._0_4_;
            fVar41 = (auVar62._4_4_ * fStack_341c + auVar93._4_4_ * fStack_336c) * auVar63._4_4_;
            fVar42 = (auVar62._8_4_ * fStack_3418 + auVar93._8_4_ * fStack_3368) * auVar63._8_4_;
            fVar43 = (auVar62._12_4_ * fStack_3414 + auVar93._12_4_ * fStack_3364) * auVar63._12_4_;
            fVar80 = (auVar93._0_4_ * local_33e0 + auVar82._0_4_ * local_3350) * auVar12._0_4_;
            fVar72 = (auVar93._4_4_ * fStack_33dc + auVar82._4_4_ * fStack_334c) * auVar12._4_4_;
            fVar75 = (auVar93._8_4_ * fStack_33d8 + auVar82._8_4_ * fStack_3348) * auVar12._8_4_;
            fVar78 = (auVar93._12_4_ * fStack_33d4 + auVar82._12_4_ * fStack_3344) * auVar12._12_4_;
          }
          auVar47 = vshufps_avx(ZEXT416((uint)(fVar81 * fVar49)),ZEXT416((uint)(fVar81 * fVar49)),0)
          ;
          auVar56 = ZEXT416((uint)(fVar44 * 3.0 * fVar49));
          auVar56 = vshufps_avx(auVar56,auVar56,0);
          auVar62 = vshufps_avx(ZEXT416((uint)(fVar81 * fVar51)),ZEXT416((uint)(fVar81 * fVar51)),0)
          ;
          auVar66 = vshufps_avx(ZEXT416((uint)(fVar44 * fVar50)),ZEXT416((uint)(fVar44 * fVar50)),0)
          ;
          fVar50 = auVar66._0_4_;
          fVar51 = auVar66._4_4_;
          fVar81 = auVar66._8_4_;
          fVar57 = auVar66._12_4_;
          fVar79 = auVar62._0_4_;
          fVar83 = auVar62._4_4_;
          fVar84 = auVar62._8_4_;
          fVar85 = auVar62._12_4_;
          fVar92 = auVar56._0_4_;
          fVar61 = auVar56._4_4_;
          fVar73 = auVar56._8_4_;
          fVar76 = auVar56._12_4_;
          fVar58 = auVar47._0_4_;
          fVar89 = auVar47._4_4_;
          fVar90 = auVar47._8_4_;
          fVar91 = auVar47._12_4_;
          fVar49 = fVar52 * fVar53 + fVar52 * fVar53;
          auVar47 = vshufps_avx(ZEXT416((uint)(fVar87 * -3.0)),ZEXT416((uint)(fVar87 * -3.0)),0);
          auVar56 = ZEXT416((uint)((fVar87 - fVar49) * 3.0));
          auVar56 = vshufps_avx(auVar56,auVar56,0);
          auVar62 = ZEXT416((uint)((fVar49 - fVar45) * 3.0));
          auVar62 = vshufps_avx(auVar62,auVar62,0);
          in_ZMM10 = ZEXT1664(auVar62);
          auVar66 = vpermilps_avx(ZEXT416((uint)(fVar45 * 3.0)),0);
          vVar55.field_0._0_4_ =
               ((fVar58 * local_3480.v[0] +
                fVar92 * local_3470 + fVar50 * local_3450 + fVar79 * local_3460) * auVar47._0_4_ +
               (fVar58 * local_3440.v[0] + fVar59 * fVar92 + fVar35 * fVar79 + fVar50 * local_3410)
               * auVar56._0_4_ +
               auVar62._0_4_ *
               (fVar58 * local_3400 + auVar97._0_4_ * fVar92 + fVar80 * fVar79 + fVar50 * local_33d0
               ) + auVar66._0_4_ *
                   (fVar58 * local_33c0.v[0] +
                   fVar92 * local_33b0.v[0] + fVar50 * local_3390 + fVar79 * local_33a0)) *
               auVar37._0_4_;
          vVar55.field_0._4_4_ =
               ((fVar89 * local_3480.v[1] +
                fVar61 * fStack_346c + fVar51 * fStack_344c + fVar83 * fStack_345c) * auVar47._4_4_
               + (fVar89 * local_3440.v[1] +
                 fVar71 * fVar61 + fVar41 * fVar83 + fVar51 * fStack_340c) * auVar56._4_4_ +
                 auVar62._4_4_ *
                 (fVar89 * fStack_33fc +
                 auVar97._4_4_ * fVar61 + fVar72 * fVar83 + fVar51 * fStack_33cc) +
                 auVar66._4_4_ *
                 (fVar89 * local_33c0.v[1] +
                 fVar61 * local_33b0.v[1] + fVar51 * fStack_338c + fVar83 * fStack_339c)) *
               auVar37._4_4_;
          vVar55.field_0._8_4_ =
               ((fVar90 * local_3480.v[2] +
                fVar73 * fStack_3468 + fVar81 * fStack_3448 + fVar84 * fStack_3458) * auVar47._8_4_
               + (fVar90 * local_3440.v[2] +
                 fVar74 * fVar73 + fVar42 * fVar84 + fVar81 * fStack_3408) * auVar56._8_4_ +
                 auVar62._8_4_ *
                 (fVar90 * fStack_33f8 +
                 auVar97._8_4_ * fVar73 + fVar75 * fVar84 + fVar81 * fStack_33c8) +
                 auVar66._8_4_ *
                 (fVar90 * local_33c0.v[2] +
                 fVar73 * local_33b0.v[2] + fVar81 * fStack_3388 + fVar84 * fStack_3398)) *
               auVar37._8_4_;
          vVar55.field_0._12_4_ =
               ((fVar91 * local_3480.v[3] +
                fVar76 * fStack_3464 + fVar57 * fStack_3444 + fVar85 * fStack_3454) * auVar47._12_4_
               + (fVar91 * local_3440.v[3] +
                 fVar77 * fVar76 + fVar43 * fVar85 + fVar57 * fStack_3404) * auVar56._12_4_ +
                 auVar62._12_4_ *
                 (fVar91 * fStack_33f4 +
                 auVar97._12_4_ * fVar76 + fVar78 * fVar85 + fVar57 * fStack_33c4) +
                 auVar66._12_4_ *
                 (fVar91 * local_33c0.v[3] +
                 fVar76 * local_33b0.v[3] + fVar57 * fStack_3384 + fVar85 * fStack_3394)) *
               auVar37._12_4_;
          *paVar29 = vVar55.field_0;
        }
        if (pvVar9 != (vfloat_impl<4> *)0x0) {
          auVar47 = vcmpps_avx(SUB6416(ZEXT464(0x3f800000),0),auVar36,0);
          auVar56 = vcmpps_avx(auVar36,ZEXT816(0) << 0x40,0);
          auVar47 = vorps_avx(auVar56,auVar47);
          bVar28 = fVar52 == 1.0 || fVar52 == 0.0;
          if (bVar28 || (auVar47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            local_3520._4_4_ = fStack_33dc;
            local_3520._0_4_ = local_33e0;
            uStack_3518._4_4_ = fStack_33d4;
            uStack_3518._0_4_ = fStack_33d8;
            fVar59 = local_3430;
            fVar71 = fStack_342c;
            fVar74 = fStack_3428;
            fVar77 = fStack_3424;
            fVar35 = local_3420;
            fVar41 = fStack_341c;
            fVar42 = fStack_3418;
            fVar43 = fStack_3414;
            fVar45 = local_33f0;
            fVar49 = fStack_33ec;
            fVar50 = fStack_33e8;
            fVar51 = fStack_33e4;
          }
          else {
            auVar62 = vshufps_avx(auVar36,auVar36,0);
            auVar66 = vshufps_avx(auVar88,auVar88,0);
            fVar59 = fVar44 + fVar52;
            auVar56 = vrcpss_avx(ZEXT416((uint)fVar59),ZEXT416((uint)fVar59));
            auVar56 = ZEXT416((uint)(auVar56._0_4_ * (2.0 - fVar59 * auVar56._0_4_)));
            auVar93 = vshufps_avx(auVar56,auVar56,0);
            fVar59 = 1.0 - fVar44;
            auVar37 = vshufps_avx(ZEXT416((uint)fVar59),ZEXT416((uint)fVar59),0);
            fVar59 = fVar59 + fVar52;
            auVar56 = vrcpss_avx(ZEXT416((uint)fVar59),ZEXT416((uint)fVar59));
            auVar56 = ZEXT416((uint)(auVar56._0_4_ * (2.0 - fVar59 * auVar56._0_4_)));
            auVar63 = vshufps_avx(auVar56,auVar56,0);
            auVar82 = vshufps_avx(ZEXT416((uint)(1.0 - fVar52)),ZEXT416((uint)(1.0 - fVar52)),0);
            fVar59 = (2.0 - fVar44) - fVar52;
            auVar56 = vrcpss_avx(ZEXT416((uint)fVar59),ZEXT416((uint)fVar59));
            auVar56 = ZEXT416((uint)(auVar56._0_4_ * (2.0 - auVar56._0_4_ * fVar59)));
            auVar56 = vshufps_avx(auVar56,auVar56,0);
            local_3520._4_4_ =
                 (auVar37._4_4_ * fStack_33dc + auVar82._4_4_ * fStack_334c) * auVar56._4_4_;
            local_3520._0_4_ =
                 (auVar37._0_4_ * local_33e0 + auVar82._0_4_ * local_3350) * auVar56._0_4_;
            uStack_3518._0_4_ =
                 (auVar37._8_4_ * fStack_33d8 + auVar82._8_4_ * fStack_3348) * auVar56._8_4_;
            uStack_3518._4_4_ =
                 (auVar37._12_4_ * fStack_33d4 + auVar82._12_4_ * fStack_3344) * auVar56._12_4_;
            fVar59 = (fVar44 + 1.0) - fVar52;
            auVar56 = vrcpss_avx(ZEXT416((uint)fVar59),ZEXT416((uint)fVar59));
            auVar56 = ZEXT416((uint)(auVar56._0_4_ * (2.0 - fVar59 * auVar56._0_4_)));
            auVar56 = vshufps_avx(auVar56,auVar56,0);
            fVar59 = (auVar62._0_4_ * local_3430 + auVar66._0_4_ * local_3380.v[0]) * auVar93._0_4_;
            fVar71 = (auVar62._4_4_ * fStack_342c + auVar66._4_4_ * local_3380.v[1]) * auVar93._4_4_
            ;
            fVar74 = (auVar62._8_4_ * fStack_3428 + auVar66._8_4_ * local_3380.v[2]) * auVar93._8_4_
            ;
            fVar77 = (auVar62._12_4_ * fStack_3424 + auVar66._12_4_ * local_3380.v[3]) *
                     auVar93._12_4_;
            fVar35 = (auVar66._0_4_ * local_3420 + auVar37._0_4_ * local_3370) * auVar63._0_4_;
            fVar41 = (auVar66._4_4_ * fStack_341c + auVar37._4_4_ * fStack_336c) * auVar63._4_4_;
            fVar42 = (auVar66._8_4_ * fStack_3418 + auVar37._8_4_ * fStack_3368) * auVar63._8_4_;
            fVar43 = (auVar66._12_4_ * fStack_3414 + auVar37._12_4_ * fStack_3364) * auVar63._12_4_;
            fVar45 = (auVar82._0_4_ * local_33f0 + auVar62._0_4_ * local_3360) * auVar56._0_4_;
            fVar49 = (auVar82._4_4_ * fStack_33ec + auVar62._4_4_ * fStack_335c) * auVar56._4_4_;
            fVar50 = (auVar82._8_4_ * fStack_33e8 + auVar62._8_4_ * fStack_3358) * auVar56._8_4_;
            fVar51 = (auVar82._12_4_ * fStack_33e4 + auVar62._12_4_ * fStack_3354) * auVar56._12_4_;
          }
          fVar53 = 1.0 - fVar44;
          fVar80 = 1.0 - fVar52;
          fVar87 = fVar80 * fVar80;
          auVar56 = ZEXT416((uint)((fVar53 - (fVar44 + fVar44)) * 6.0));
          auVar56 = vshufps_avx(auVar56,auVar56,0);
          auVar62 = vshufps_avx(ZEXT416((uint)(fVar44 * 6.0)),ZEXT416((uint)(fVar44 * 6.0)),0);
          fVar85 = auVar62._0_4_;
          fVar86 = auVar62._4_4_;
          fVar95 = auVar62._8_4_;
          fVar96 = auVar62._12_4_;
          fVar91 = auVar56._0_4_;
          fVar92 = auVar56._4_4_;
          fVar61 = auVar56._8_4_;
          fVar73 = auVar56._12_4_;
          auVar56 = ZEXT416((uint)((fVar44 - (fVar53 + fVar53)) * 6.0));
          auVar56 = vshufps_avx(auVar56,auVar56,0);
          fVar76 = auVar56._0_4_;
          fVar79 = auVar56._4_4_;
          fVar83 = auVar56._8_4_;
          fVar84 = auVar56._12_4_;
          auVar56 = vshufps_avx(ZEXT416((uint)(fVar53 * 6.0)),ZEXT416((uint)(fVar53 * 6.0)),0);
          fVar57 = auVar56._0_4_;
          fVar58 = auVar56._4_4_;
          fVar89 = auVar56._8_4_;
          fVar90 = auVar56._12_4_;
          auVar56 = vshufps_avx(ZEXT416((uint)(fVar87 * fVar80)),ZEXT416((uint)(fVar87 * fVar80)),0)
          ;
          fVar81 = fVar52 * fVar52;
          auVar62 = ZEXT416((uint)(fVar52 * 3.0 * fVar87));
          auVar62 = vshufps_avx(auVar62,auVar62,0);
          auVar66 = ZEXT416((uint)(fVar81 * 3.0 * fVar80));
          auVar66 = vshufps_avx(auVar66,auVar66,0);
          auVar93 = vshufps_avx(ZEXT416((uint)(fVar81 * fVar52)),ZEXT416((uint)(fVar81 * fVar52)),0)
          ;
          auVar37 = vshufps_avx(ZEXT416((uint)(fVar60 * fVar60)),ZEXT416((uint)(fVar60 * fVar60)),0)
          ;
          fVar60 = auVar37._0_4_;
          fVar72 = auVar37._4_4_;
          fVar75 = auVar37._8_4_;
          fVar78 = auVar37._12_4_;
          (pvVar9->field_0).v[0] =
               fVar60 * (auVar56._0_4_ *
                         (fVar57 * local_3480.v[0] +
                         fVar76 * local_3470 + fVar85 * local_3450 + fVar91 * local_3460) +
                        auVar62._0_4_ *
                        (fVar57 * local_3440.v[0] +
                        fVar76 * fVar59 + fVar85 * local_3410 + fVar91 * fVar35) +
                        auVar66._0_4_ *
                        (fVar57 * local_3400 +
                        fVar76 * fVar45 + fVar91 * (float)local_3520 + fVar85 * local_33d0) +
                        auVar93._0_4_ *
                        (fVar76 * local_33b0.v[0] + fVar85 * local_3390 + fVar91 * local_33a0 +
                        fVar57 * local_33c0.v[0]));
          (pvVar9->field_0).v[1] =
               fVar72 * (auVar56._4_4_ *
                         (fVar58 * local_3480.v[1] +
                         fVar79 * fStack_346c + fVar86 * fStack_344c + fVar92 * fStack_345c) +
                        auVar62._4_4_ *
                        (fVar58 * local_3440.v[1] +
                        fVar79 * fVar71 + fVar86 * fStack_340c + fVar92 * fVar41) +
                        auVar66._4_4_ *
                        (fVar58 * fStack_33fc +
                        fVar79 * fVar49 + fVar92 * local_3520._4_4_ + fVar86 * fStack_33cc) +
                        auVar93._4_4_ *
                        (fVar79 * local_33b0.v[1] + fVar86 * fStack_338c + fVar92 * fStack_339c +
                        fVar58 * local_33c0.v[1]));
          (pvVar9->field_0).v[2] =
               fVar75 * (auVar56._8_4_ *
                         (fVar89 * local_3480.v[2] +
                         fVar83 * fStack_3468 + fVar95 * fStack_3448 + fVar61 * fStack_3458) +
                        auVar62._8_4_ *
                        (fVar89 * local_3440.v[2] +
                        fVar83 * fVar74 + fVar95 * fStack_3408 + fVar61 * fVar42) +
                        auVar66._8_4_ *
                        (fVar89 * fStack_33f8 +
                        fVar83 * fVar50 + fVar61 * (float)uStack_3518 + fVar95 * fStack_33c8) +
                        auVar93._8_4_ *
                        (fVar83 * local_33b0.v[2] + fVar95 * fStack_3388 + fVar61 * fStack_3398 +
                        fVar89 * local_33c0.v[2]));
          (pvVar9->field_0).v[3] =
               fVar78 * (auVar56._12_4_ *
                         (fVar90 * local_3480.v[3] +
                         fVar84 * fStack_3464 + fVar96 * fStack_3444 + fVar73 * fStack_3454) +
                        auVar62._12_4_ *
                        (fVar90 * local_3440.v[3] +
                        fVar84 * fVar77 + fVar96 * fStack_3404 + fVar73 * fVar43) +
                        auVar66._12_4_ *
                        (fVar90 * fStack_33f4 +
                        fVar84 * fVar51 + fVar73 * uStack_3518._4_4_ + fVar96 * fStack_33c4) +
                        auVar93._12_4_ *
                        (fVar84 * local_33b0.v[3] + fVar96 * fStack_3384 + fVar73 * fStack_3394 +
                        fVar90 * local_33c0.v[3]));
          auVar56 = ZEXT416((uint)fVar53);
          auVar62 = ZEXT416((uint)fVar80);
          if (bVar28 || (auVar47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            local_34a0 = local_33e0;
            fStack_349c = fStack_33dc;
            fStack_3498 = fStack_33d8;
            fStack_3494 = fStack_33d4;
            fVar59 = local_3430;
            fVar71 = fStack_342c;
            fVar74 = fStack_3428;
            fVar77 = fStack_3424;
            fVar35 = local_3420;
            fVar41 = fStack_341c;
            fVar42 = fStack_3418;
            fVar43 = fStack_3414;
            fVar45 = local_33f0;
            fVar49 = fStack_33ec;
            fVar50 = fStack_33e8;
            fVar51 = fStack_33e4;
          }
          else {
            auVar93 = vshufps_avx(auVar36,auVar36,0);
            auVar37 = vshufps_avx(auVar88,auVar88,0);
            fVar59 = fVar44 + fVar52;
            auVar66 = vrcpss_avx(ZEXT416((uint)fVar59),ZEXT416((uint)fVar59));
            auVar66 = ZEXT416((uint)(auVar66._0_4_ * (2.0 - auVar66._0_4_ * fVar59)));
            auVar63 = vshufps_avx(auVar66,auVar66,0);
            auVar82 = vshufps_avx(auVar56,auVar56,0);
            fVar59 = fVar53 + fVar52;
            auVar66 = vrcpss_avx(ZEXT416((uint)fVar59),ZEXT416((uint)fVar59));
            auVar66 = ZEXT416((uint)(auVar66._0_4_ * (2.0 - fVar59 * auVar66._0_4_)));
            auVar12 = vshufps_avx(auVar66,auVar66,0);
            auVar38 = vshufps_avx(auVar62,auVar62,0);
            fVar59 = (2.0 - fVar44) - fVar52;
            auVar66 = vrcpss_avx(ZEXT416((uint)fVar59),ZEXT416((uint)fVar59));
            auVar66 = ZEXT416((uint)(auVar66._0_4_ * (2.0 - auVar66._0_4_ * fVar59)));
            auVar66 = vshufps_avx(auVar66,auVar66,0);
            local_34a0 = (auVar82._0_4_ * local_33e0 + auVar38._0_4_ * local_3350) * auVar66._0_4_;
            fStack_349c = (auVar82._4_4_ * fStack_33dc + auVar38._4_4_ * fStack_334c) *
                          auVar66._4_4_;
            fStack_3498 = (auVar82._8_4_ * fStack_33d8 + auVar38._8_4_ * fStack_3348) *
                          auVar66._8_4_;
            fStack_3494 = (auVar82._12_4_ * fStack_33d4 + auVar38._12_4_ * fStack_3344) *
                          auVar66._12_4_;
            fVar59 = (fVar44 + 1.0) - fVar52;
            auVar66 = vrcpss_avx(ZEXT416((uint)fVar59),ZEXT416((uint)fVar59));
            auVar66 = ZEXT416((uint)(auVar66._0_4_ * (2.0 - fVar59 * auVar66._0_4_)));
            auVar66 = vshufps_avx(auVar66,auVar66,0);
            fVar59 = (auVar93._0_4_ * local_3430 + auVar37._0_4_ * local_3380.v[0]) * auVar63._0_4_;
            fVar71 = (auVar93._4_4_ * fStack_342c + auVar37._4_4_ * local_3380.v[1]) * auVar63._4_4_
            ;
            fVar74 = (auVar93._8_4_ * fStack_3428 + auVar37._8_4_ * local_3380.v[2]) * auVar63._8_4_
            ;
            fVar77 = (auVar93._12_4_ * fStack_3424 + auVar37._12_4_ * local_3380.v[3]) *
                     auVar63._12_4_;
            fVar35 = (auVar82._0_4_ * local_3370 + auVar37._0_4_ * local_3420) * auVar12._0_4_;
            fVar41 = (auVar82._4_4_ * fStack_336c + auVar37._4_4_ * fStack_341c) * auVar12._4_4_;
            fVar42 = (auVar82._8_4_ * fStack_3368 + auVar37._8_4_ * fStack_3418) * auVar12._8_4_;
            fVar43 = (auVar82._12_4_ * fStack_3364 + auVar37._12_4_ * fStack_3414) * auVar12._12_4_;
            fVar45 = (auVar38._0_4_ * local_33f0 + auVar93._0_4_ * local_3360) * auVar66._0_4_;
            fVar49 = (auVar38._4_4_ * fStack_33ec + auVar93._4_4_ * fStack_335c) * auVar66._4_4_;
            fVar50 = (auVar38._8_4_ * fStack_33e8 + auVar93._8_4_ * fStack_3358) * auVar66._8_4_;
            fVar51 = (auVar38._12_4_ * fStack_33e4 + auVar93._12_4_ * fStack_3354) * auVar66._12_4_;
          }
          fVar57 = fVar53 * fVar53;
          fVar58 = fVar44 * fVar44;
          auVar66 = ZEXT416((uint)(fVar53 * fVar58 * 3.0));
          auVar66 = vshufps_avx(auVar66,auVar66,0);
          auVar93 = vshufps_avx(ZEXT416((uint)(fVar58 * fVar44)),ZEXT416((uint)(fVar58 * fVar44)),0)
          ;
          fVar83 = auVar93._0_4_;
          fVar84 = auVar93._4_4_;
          fVar85 = auVar93._8_4_;
          fVar86 = auVar93._12_4_;
          fVar95 = auVar66._0_4_;
          fVar96 = auVar66._4_4_;
          fVar99 = auVar66._8_4_;
          fVar100 = auVar66._12_4_;
          auVar66 = ZEXT416((uint)(fVar57 * fVar44 * 3.0));
          auVar66 = vshufps_avx(auVar66,auVar66,0);
          fVar61 = auVar66._0_4_;
          fVar73 = auVar66._4_4_;
          fVar76 = auVar66._8_4_;
          fVar79 = auVar66._12_4_;
          auVar66 = vshufps_avx(ZEXT416((uint)(fVar57 * fVar53)),ZEXT416((uint)(fVar57 * fVar53)),0)
          ;
          fVar89 = auVar66._0_4_;
          fVar90 = auVar66._4_4_;
          fVar91 = auVar66._8_4_;
          fVar92 = auVar66._12_4_;
          auVar66 = vshufps_avx(ZEXT416((uint)(fVar80 * 6.0)),ZEXT416((uint)(fVar80 * 6.0)),0);
          auVar93 = ZEXT416((uint)((fVar52 - (fVar80 + fVar80)) * 6.0));
          auVar93 = vshufps_avx(auVar93,auVar93,0);
          auVar37 = ZEXT416((uint)((fVar80 - (fVar52 + fVar52)) * 6.0));
          auVar37 = vshufps_avx(auVar37,auVar37,0);
          auVar63 = vshufps_avx(ZEXT416((uint)(fVar52 * 6.0)),ZEXT416((uint)(fVar52 * 6.0)),0);
          (pvVar10->field_0).v[0] =
               fVar60 * (auVar66._0_4_ *
                         (fVar89 * local_3480.v[0] +
                         fVar61 * local_3470 + fVar95 * local_3460 + fVar83 * local_3450) +
                        auVar93._0_4_ *
                        (fVar89 * local_3440.v[0] +
                        fVar59 * fVar61 + fVar95 * fVar35 + fVar83 * local_3410) +
                        auVar37._0_4_ *
                        (fVar89 * local_3400 +
                        fVar45 * fVar61 + fVar95 * local_34a0 + fVar83 * local_33d0) +
                        auVar63._0_4_ *
                        (fVar89 * local_33c0.v[0] +
                        fVar61 * local_33b0.v[0] + fVar95 * local_33a0 + fVar83 * local_3390));
          (pvVar10->field_0).v[1] =
               fVar72 * (auVar66._4_4_ *
                         (fVar90 * local_3480.v[1] +
                         fVar73 * fStack_346c + fVar96 * fStack_345c + fVar84 * fStack_344c) +
                        auVar93._4_4_ *
                        (fVar90 * local_3440.v[1] +
                        fVar71 * fVar73 + fVar96 * fVar41 + fVar84 * fStack_340c) +
                        auVar37._4_4_ *
                        (fVar90 * fStack_33fc +
                        fVar49 * fVar73 + fVar96 * fStack_349c + fVar84 * fStack_33cc) +
                        auVar63._4_4_ *
                        (fVar90 * local_33c0.v[1] +
                        fVar73 * local_33b0.v[1] + fVar96 * fStack_339c + fVar84 * fStack_338c));
          (pvVar10->field_0).v[2] =
               fVar75 * (auVar66._8_4_ *
                         (fVar91 * local_3480.v[2] +
                         fVar76 * fStack_3468 + fVar99 * fStack_3458 + fVar85 * fStack_3448) +
                        auVar93._8_4_ *
                        (fVar91 * local_3440.v[2] +
                        fVar74 * fVar76 + fVar99 * fVar42 + fVar85 * fStack_3408) +
                        auVar37._8_4_ *
                        (fVar91 * fStack_33f8 +
                        fVar50 * fVar76 + fVar99 * fStack_3498 + fVar85 * fStack_33c8) +
                        auVar63._8_4_ *
                        (fVar91 * local_33c0.v[2] +
                        fVar76 * local_33b0.v[2] + fVar99 * fStack_3398 + fVar85 * fStack_3388));
          (pvVar10->field_0).v[3] =
               fVar78 * (auVar66._12_4_ *
                         (fVar92 * local_3480.v[3] +
                         fVar79 * fStack_3464 + fVar100 * fStack_3454 + fVar86 * fStack_3444) +
                        auVar93._12_4_ *
                        (fVar92 * local_3440.v[3] +
                        fVar77 * fVar79 + fVar100 * fVar43 + fVar86 * fStack_3404) +
                        auVar37._12_4_ *
                        (fVar92 * fStack_33f4 +
                        fVar51 * fVar79 + fVar100 * fStack_3494 + fVar86 * fStack_33c4) +
                        auVar63._12_4_ *
                        (fVar92 * local_33c0.v[3] +
                        fVar79 * local_33b0.v[3] + fVar100 * fStack_3394 + fVar86 * fStack_3384));
          if (bVar28 || (auVar47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            auVar88._4_4_ = fStack_342c;
            auVar88._0_4_ = local_3430;
            auVar88._8_4_ = fStack_3428;
            auVar88._12_4_ = fStack_3424;
            auVar94._4_4_ = fStack_341c;
            auVar94._0_4_ = local_3420;
            auVar94._8_4_ = fStack_3418;
            auVar94._12_4_ = fStack_3414;
            auVar98._4_4_ = fStack_33ec;
            auVar98._0_4_ = local_33f0;
            auVar98._8_4_ = fStack_33e8;
            auVar98._12_4_ = fStack_33e4;
            fVar59 = local_33e0;
            fVar71 = fStack_33dc;
            fVar74 = fStack_33d8;
            fVar77 = fStack_33d4;
          }
          else {
            auVar47 = vshufps_avx(auVar36,auVar36,0);
            auVar66 = vshufps_avx(auVar88,auVar88,0);
            fVar59 = fVar44 + fVar52;
            auVar88 = vrcpss_avx(ZEXT416((uint)fVar59),ZEXT416((uint)fVar59));
            auVar88 = ZEXT416((uint)(auVar88._0_4_ * (2.0 - auVar88._0_4_ * fVar59)));
            auVar36 = vshufps_avx(auVar88,auVar88,0);
            auVar56 = vshufps_avx(auVar56,auVar56,0);
            auVar88._0_4_ =
                 (auVar47._0_4_ * local_3430 + auVar66._0_4_ * local_3380.v[0]) * auVar36._0_4_;
            auVar88._4_4_ =
                 (auVar47._4_4_ * fStack_342c + auVar66._4_4_ * local_3380.v[1]) * auVar36._4_4_;
            auVar88._8_4_ =
                 (auVar47._8_4_ * fStack_3428 + auVar66._8_4_ * local_3380.v[2]) * auVar36._8_4_;
            auVar88._12_4_ =
                 (auVar47._12_4_ * fStack_3424 + auVar66._12_4_ * local_3380.v[3]) * auVar36._12_4_;
            fVar59 = fVar53 + fVar52;
            auVar36 = vrcpss_avx(ZEXT416((uint)fVar59),ZEXT416((uint)fVar59));
            auVar36 = ZEXT416((uint)(auVar36._0_4_ * (2.0 - fVar59 * auVar36._0_4_)));
            auVar36 = vshufps_avx(auVar36,auVar36,0);
            auVar94._0_4_ =
                 (auVar56._0_4_ * local_3370 + auVar66._0_4_ * local_3420) * auVar36._0_4_;
            auVar94._4_4_ =
                 (auVar56._4_4_ * fStack_336c + auVar66._4_4_ * fStack_341c) * auVar36._4_4_;
            auVar94._8_4_ =
                 (auVar56._8_4_ * fStack_3368 + auVar66._8_4_ * fStack_3418) * auVar36._8_4_;
            auVar94._12_4_ =
                 (auVar56._12_4_ * fStack_3364 + auVar66._12_4_ * fStack_3414) * auVar36._12_4_;
            auVar62 = vshufps_avx(auVar62,auVar62,0);
            fVar59 = (2.0 - fVar44) - fVar52;
            auVar36 = vrcpss_avx(ZEXT416((uint)fVar59),ZEXT416((uint)fVar59));
            auVar36 = ZEXT416((uint)(auVar36._0_4_ * (2.0 - auVar36._0_4_ * fVar59)));
            auVar66 = vshufps_avx(auVar36,auVar36,0);
            fVar59 = (fVar44 + 1.0) - fVar52;
            auVar36 = vrcpss_avx(ZEXT416((uint)fVar59),ZEXT416((uint)fVar59));
            auVar36 = ZEXT416((uint)(auVar36._0_4_ * (2.0 - fVar59 * auVar36._0_4_)));
            auVar36 = vshufps_avx(auVar36,auVar36,0);
            auVar98._0_4_ =
                 (auVar62._0_4_ * local_33f0 + auVar47._0_4_ * local_3360) * auVar36._0_4_;
            auVar98._4_4_ =
                 (auVar62._4_4_ * fStack_33ec + auVar47._4_4_ * fStack_335c) * auVar36._4_4_;
            auVar98._8_4_ =
                 (auVar62._8_4_ * fStack_33e8 + auVar47._8_4_ * fStack_3358) * auVar36._8_4_;
            auVar98._12_4_ =
                 (auVar62._12_4_ * fStack_33e4 + auVar47._12_4_ * fStack_3354) * auVar36._12_4_;
            fVar59 = (auVar56._0_4_ * local_33e0 + auVar62._0_4_ * local_3350) * auVar66._0_4_;
            fVar71 = (auVar56._4_4_ * fStack_33dc + auVar62._4_4_ * fStack_334c) * auVar66._4_4_;
            fVar74 = (auVar56._8_4_ * fStack_33d8 + auVar62._8_4_ * fStack_3348) * auVar66._8_4_;
            fVar77 = (auVar56._12_4_ * fStack_33d4 + auVar62._12_4_ * fStack_3344) * auVar66._12_4_;
          }
          fVar44 = fVar44 * fVar53 + fVar44 * fVar53;
          auVar36 = vshufps_avx(ZEXT416((uint)(fVar57 * -3.0)),ZEXT416((uint)(fVar57 * -3.0)),0);
          auVar47 = ZEXT416((uint)((fVar44 - fVar58) * 3.0));
          auVar47 = vshufps_avx(auVar47,auVar47,0);
          auVar56 = vpermilps_avx(ZEXT416((uint)(fVar58 * 3.0)),0);
          fVar90 = auVar56._0_4_;
          fVar91 = auVar56._4_4_;
          fVar92 = auVar56._8_4_;
          fVar61 = auVar56._12_4_;
          fVar45 = auVar47._0_4_;
          fVar49 = auVar47._4_4_;
          fVar50 = auVar47._8_4_;
          fVar51 = auVar47._12_4_;
          auVar47 = ZEXT416((uint)((fVar57 - fVar44) * 3.0));
          auVar47 = vshufps_avx(auVar47,auVar47,0);
          fVar53 = auVar47._0_4_;
          fVar57 = auVar47._4_4_;
          fVar58 = auVar47._8_4_;
          fVar89 = auVar47._12_4_;
          fVar35 = auVar36._0_4_;
          fVar41 = auVar36._4_4_;
          fVar42 = auVar36._8_4_;
          fVar43 = auVar36._12_4_;
          fVar44 = fVar52 * fVar80 + fVar52 * fVar80;
          in_ZMM10 = ZEXT464((uint)fVar87);
          auVar36 = vshufps_avx(ZEXT416((uint)(fVar87 * -3.0)),ZEXT416((uint)(fVar87 * -3.0)),0);
          auVar47 = ZEXT416((uint)((fVar87 - fVar44) * 3.0));
          auVar47 = vshufps_avx(auVar47,auVar47,0);
          auVar56 = ZEXT416((uint)((fVar44 - fVar81) * 3.0));
          auVar56 = vshufps_avx(auVar56,auVar56,0);
          auVar62 = vpermilps_avx(ZEXT416((uint)(fVar81 * 3.0)),0);
          (pvVar11->field_0).v[0] =
               fVar60 * (auVar36._0_4_ *
                         (fVar35 * local_3480.v[0] +
                         fVar53 * local_3470 + fVar90 * local_3450 + fVar45 * local_3460) +
                        auVar47._0_4_ *
                        (fVar35 * local_3440.v[0] +
                        auVar88._0_4_ * fVar53 + auVar94._0_4_ * fVar45 + fVar90 * local_3410) +
                        auVar56._0_4_ *
                        (fVar35 * local_3400 +
                        auVar98._0_4_ * fVar53 + fVar59 * fVar45 + fVar90 * local_33d0) +
                        auVar62._0_4_ *
                        (fVar35 * local_33c0.v[0] +
                        fVar53 * local_33b0.v[0] + fVar90 * local_3390 + fVar45 * local_33a0));
          (pvVar11->field_0).v[1] =
               fVar72 * (auVar36._4_4_ *
                         (fVar41 * local_3480.v[1] +
                         fVar57 * fStack_346c + fVar91 * fStack_344c + fVar49 * fStack_345c) +
                        auVar47._4_4_ *
                        (fVar41 * local_3440.v[1] +
                        auVar88._4_4_ * fVar57 + auVar94._4_4_ * fVar49 + fVar91 * fStack_340c) +
                        auVar56._4_4_ *
                        (fVar41 * fStack_33fc +
                        auVar98._4_4_ * fVar57 + fVar71 * fVar49 + fVar91 * fStack_33cc) +
                        auVar62._4_4_ *
                        (fVar41 * local_33c0.v[1] +
                        fVar57 * local_33b0.v[1] + fVar91 * fStack_338c + fVar49 * fStack_339c));
          (pvVar11->field_0).v[2] =
               fVar75 * (auVar36._8_4_ *
                         (fVar42 * local_3480.v[2] +
                         fVar58 * fStack_3468 + fVar92 * fStack_3448 + fVar50 * fStack_3458) +
                        auVar47._8_4_ *
                        (fVar42 * local_3440.v[2] +
                        auVar88._8_4_ * fVar58 + auVar94._8_4_ * fVar50 + fVar92 * fStack_3408) +
                        auVar56._8_4_ *
                        (fVar42 * fStack_33f8 +
                        auVar98._8_4_ * fVar58 + fVar74 * fVar50 + fVar92 * fStack_33c8) +
                        auVar62._8_4_ *
                        (fVar42 * local_33c0.v[2] +
                        fVar58 * local_33b0.v[2] + fVar92 * fStack_3388 + fVar50 * fStack_3398));
          (pvVar11->field_0).v[3] =
               fVar78 * (auVar36._12_4_ *
                         (fVar43 * local_3480.v[3] +
                         fVar89 * fStack_3464 + fVar61 * fStack_3444 + fVar51 * fStack_3454) +
                        auVar47._12_4_ *
                        (fVar43 * local_3440.v[3] +
                        auVar88._12_4_ * fVar89 + auVar94._12_4_ * fVar51 + fVar61 * fStack_3404) +
                        auVar56._12_4_ *
                        (fVar43 * fStack_33f4 +
                        auVar98._12_4_ * fVar89 + fVar77 * fVar51 + fVar61 * fStack_33c4) +
                        auVar62._12_4_ *
                        (fVar43 * local_33c0.v[3] +
                        fVar89 * local_33b0.v[3] + fVar61 * fStack_3384 + fVar51 * fStack_3394));
        }
      }
      bVar28 = false;
    }
    if (!bVar28) {
      return;
    }
  } while( true );
}

Assistant:

void eval(CatmullClarkPatch& patch, Vec2f uv, float dscale, size_t depth, 
                  BezierCurve* border0 = nullptr, BezierCurve* border1 = nullptr, BezierCurve* border2 = nullptr, BezierCurve* border3 = nullptr)
        {
          while (true) 
          {
            typename CatmullClarkPatch::Type ty = patch.type();

            if (unlikely(final(patch,ty,depth)))
            {
              if (ty & CatmullClarkRing::TYPE_REGULAR) { 
                RegularPatch(patch,border0,border1,border2,border3).eval(uv.x,uv.y,P,dPdu,dPdv,ddPdudu,ddPdvdv,ddPdudv,dscale); 
                PATCH_DEBUG_SUBDIVISION(234423,c,c,-1);
                return;
              } else {
                IrregularFillPatch(patch,border0,border1,border2,border3).eval(uv.x,uv.y,P,dPdu,dPdv,ddPdudu,ddPdvdv,ddPdudv,dscale); 
                PATCH_DEBUG_SUBDIVISION(34534,c,-1,c);
                return;
              }
            }
            else if (ty & CatmullClarkRing::TYPE_REGULAR_CREASES) { 
              assert(depth > 0); 
              RegularPatch(patch,border0,border1,border2,border3).eval(uv.x,uv.y,P,dPdu,dPdv,ddPdudu,ddPdvdv,ddPdudv,dscale); 
              PATCH_DEBUG_SUBDIVISION(43524,c,c,-1);
              return;
            }
#if PATCH_USE_GREGORY == 2
            else if (ty & CatmullClarkRing::TYPE_GREGORY_CREASES) { 
              assert(depth > 0); 
              GregoryPatch(patch,border0,border1,border2,border3).eval(uv.x,uv.y,P,dPdu,dPdv,ddPdudu,ddPdvdv,ddPdudv,dscale); 
              PATCH_DEBUG_SUBDIVISION(23498,c,-1,c);
              return;
            }
#endif
            else
            {
              array_t<CatmullClarkPatch,4> patches; 
              patch.subdivide(patches); // FIXME: only have to generate one of the patches
              
              const float u = uv.x, v = uv.y;
              if (v < 0.5f) {
                if (u < 0.5f) { patch = patches[0]; uv = Vec2f(2.0f*u,2.0f*v); dscale *= 2.0f; }
                else          { patch = patches[1]; uv = Vec2f(2.0f*u-1.0f,2.0f*v); dscale *= 2.0f; }
              } else {
                if (u > 0.5f) { patch = patches[2]; uv = Vec2f(2.0f*u-1.0f,2.0f*v-1.0f); dscale *= 2.0f; }
                else          { patch = patches[3]; uv = Vec2f(2.0f*u,2.0f*v-1.0f); dscale *= 2.0f; }
              }
              depth++;
            }
          }